

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_copy_to_file.cpp
# Opt level: O3

void duckdb::PhysicalCopyToFile::ReturnStatistics
               (DataChunk *chunk,idx_t row_idx,CopyToFileInfo *info)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  type pCVar3;
  _Rb_tree_node_base *p_Var4;
  _Base_ptr p_Var5;
  _Hash_node_base *p_Var6;
  _Hash_node_base *p_Var7;
  vector<duckdb::Value,_true> stats_values;
  LogicalType map_val_type;
  vector<duckdb::Value,_true> values;
  vector<duckdb::Value,_true> keys;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  stats;
  LogicalType local_278;
  LogicalType local_258;
  pointer local_238;
  pointer pVStack_230;
  pointer local_228;
  _Rb_tree_node_base *local_220;
  _Rb_tree_node_base *local_218;
  undefined8 local_210;
  _Hash_node_base *local_208;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>
  local_200;
  DataChunk *local_1a0;
  idx_t local_198;
  CopyToFileInfo *local_190;
  Value local_188;
  LogicalType local_148;
  LogicalType local_128;
  LogicalType local_108;
  LogicalType local_f0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  local_d8;
  vector<duckdb::Value,_true> local_a8;
  vector<duckdb::Value,_true> local_88;
  string local_68;
  LogicalType local_48;
  
  pCVar3 = unique_ptr<duckdb::CopyFunctionFileStatistics,_std::default_delete<duckdb::CopyFunctionFileStatistics>,_true>
           ::operator*(&info->file_stats);
  pcVar2 = (info->file_path)._M_dataplus._M_p;
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_68,pcVar2,pcVar2 + (info->file_path)._M_string_length);
  Value::Value((Value *)&local_200,&local_68);
  DataChunk::SetValue(chunk,0,row_idx,(Value *)&local_200);
  Value::~Value((Value *)&local_200);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  Value::UBIGINT((Value *)&local_200,pCVar3->row_count);
  DataChunk::SetValue(chunk,1,row_idx,(Value *)&local_200);
  Value::~Value((Value *)&local_200);
  Value::UBIGINT((Value *)&local_200,pCVar3->file_size_bytes);
  DataChunk::SetValue(chunk,2,row_idx,(Value *)&local_200);
  Value::~Value((Value *)&local_200);
  DataChunk::SetValue(chunk,3,row_idx,&pCVar3->footer_size_bytes);
  local_d8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_d8._M_impl.super__Rb_tree_header._M_header;
  local_d8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_d8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_d8._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var6 = (pCVar3->column_statistics)._M_h._M_before_begin._M_nxt;
  local_d8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_d8._M_impl.super__Rb_tree_header._M_header._M_left;
  if (p_Var6 == (_Hash_node_base *)0x0) {
    local_188.type_._0_8_ = (pointer)0x0;
    local_188.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_188.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_228 = (pointer)0x0;
    local_238 = (pointer)0x0;
    pVStack_230 = (pointer)0x0;
  }
  else {
    paVar1 = &local_200.first.field_2;
    local_1a0 = chunk;
    local_198 = row_idx;
    local_190 = info;
    do {
      pVStack_230 = (pointer)((ulong)pVStack_230 & 0xffffffff00000000);
      local_228 = (pointer)0x0;
      local_220 = (_Rb_tree_node_base *)&pVStack_230;
      local_210 = 0;
      p_Var7 = p_Var6[7]._M_nxt;
      local_218 = local_220;
      local_208 = p_Var6;
      if (p_Var7 == (_Hash_node_base *)0x0) {
        local_258.id_ = INVALID;
        local_258.physical_type_ = ~INVALID;
        local_258._2_6_ = 0;
        local_258.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_258.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_278.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_278.id_ = INVALID;
        local_278.physical_type_ = ~INVALID;
        local_278._2_6_ = 0;
        local_278.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
      }
      else {
        do {
          ::std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>
          ::pair<duckdb::Value_&,_true>
                    (&local_200,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (p_Var7 + 1),(Value *)(p_Var7 + 5));
          ::std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::Value>,std::_Select1st<std::pair<std::__cxx11::string_const,duckdb::Value>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::Value>>>
          ::_M_emplace_unique<std::pair<std::__cxx11::string,duckdb::Value>>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::Value>,std::_Select1st<std::pair<std::__cxx11::string_const,duckdb::Value>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::Value>>>
                      *)&local_238,&local_200);
          Value::~Value(&local_200.second);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_200.first._M_dataplus._M_p != paVar1) {
            operator_delete(local_200.first._M_dataplus._M_p);
          }
          p_Var7 = p_Var7->_M_nxt;
        } while (p_Var7 != (_Hash_node_base *)0x0);
        local_258.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_258.id_ = INVALID;
        local_258.physical_type_ = ~INVALID;
        local_258._2_6_ = 0;
        local_258.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_278.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_278.id_ = INVALID;
        local_278.physical_type_ = ~INVALID;
        local_278._2_6_ = 0;
        local_278.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        for (p_Var4 = local_220; p_Var4 != (_Rb_tree_node_base *)&pVStack_230;
            p_Var4 = (_Rb_tree_node_base *)::std::_Rb_tree_increment(p_Var4)) {
          ::std::vector<duckdb::Value,std::allocator<duckdb::Value>>::
          emplace_back<std::__cxx11::string_const&>
                    ((vector<duckdb::Value,std::allocator<duckdb::Value>> *)&local_258,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (p_Var4 + 1));
          ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::emplace_back<duckdb::Value>
                    ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_278,
                     (Value *)(p_Var4 + 2));
        }
      }
      LogicalType::LogicalType((LogicalType *)&local_200,VARCHAR);
      LogicalType::LogicalType(&local_48,VARCHAR);
      local_128.id_ = local_258.id_;
      local_128.physical_type_ = local_258.physical_type_;
      local_128._2_6_ = local_258._2_6_;
      local_128.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           local_258.type_info_.internal.
           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_128.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           local_258.type_info_.internal.
           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      local_258.id_ = INVALID;
      local_258.physical_type_ = ~INVALID;
      local_258._2_6_ = 0;
      local_258.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_258.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_148.id_ = local_278.id_;
      local_148.physical_type_ = local_278.physical_type_;
      local_148._2_6_ = local_278._2_6_;
      local_148.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           local_278.type_info_.internal.
           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_148.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           local_278.type_info_.internal.
           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      local_278.id_ = INVALID;
      local_278.physical_type_ = ~INVALID;
      local_278._2_6_ = 0;
      local_278.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_278.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      Value::MAP(&local_188,(LogicalType *)&local_200,&local_48,
                 (vector<duckdb::Value,_true> *)&local_128,(vector<duckdb::Value,_true> *)&local_148
                );
      ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
                ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_148);
      ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
                ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_128);
      LogicalType::~LogicalType(&local_48);
      LogicalType::~LogicalType((LogicalType *)&local_200);
      local_200.first._M_dataplus._M_p = (pointer)paVar1;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_200,local_208[1]._M_nxt,
                 (long)&(local_208[1]._M_nxt)->_M_nxt + (long)&(local_208[2]._M_nxt)->_M_nxt);
      Value::Value(&local_200.second,&local_188);
      ::std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::Value>,std::_Select1st<std::pair<std::__cxx11::string_const,duckdb::Value>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::Value>>>
      ::_M_emplace_unique<std::pair<std::__cxx11::string,duckdb::Value>>
                ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::Value>,std::_Select1st<std::pair<std::__cxx11::string_const,duckdb::Value>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::Value>>>
                  *)&local_d8,&local_200);
      Value::~Value(&local_200.second);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_200.first._M_dataplus._M_p != paVar1) {
        operator_delete(local_200.first._M_dataplus._M_p);
      }
      Value::~Value(&local_188);
      ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
                ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_278);
      ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
                ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_258);
      ::std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
                   *)&local_238);
      info = local_190;
      row_idx = local_198;
      chunk = local_1a0;
      p_Var6 = local_208->_M_nxt;
    } while (p_Var6 != (_Hash_node_base *)0x0);
    local_188.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_188.type_._0_8_ = (pointer)0x0;
    local_188.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_228 = (pointer)0x0;
    local_238 = (pointer)0x0;
    pVStack_230 = (pointer)0x0;
    if ((_Rb_tree_header *)local_d8._M_impl.super__Rb_tree_header._M_header._M_left !=
        &local_d8._M_impl.super__Rb_tree_header) {
      p_Var5 = local_d8._M_impl.super__Rb_tree_header._M_header._M_left;
      do {
        ::std::vector<duckdb::Value,std::allocator<duckdb::Value>>::
        emplace_back<std::__cxx11::string_const&>
                  ((vector<duckdb::Value,std::allocator<duckdb::Value>> *)&local_188,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(p_Var5 + 1)
                  );
        ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::emplace_back<duckdb::Value>
                  ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_238,
                   (Value *)(p_Var5 + 2));
        p_Var5 = (_Base_ptr)::std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var5);
      } while ((_Rb_tree_header *)p_Var5 != &local_d8._M_impl.super__Rb_tree_header);
    }
  }
  LogicalType::LogicalType(&local_f0,VARCHAR);
  LogicalType::LogicalType(&local_108,VARCHAR);
  LogicalType::MAP(&local_258,&local_f0,&local_108);
  LogicalType::~LogicalType(&local_108);
  LogicalType::~LogicalType(&local_f0);
  LogicalType::LogicalType(&local_278,VARCHAR);
  local_88.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)local_188.type_._0_8_;
  local_88.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)local_188.type_.type_info_.internal.
                       super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_88.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       (pointer)local_188.type_.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi;
  local_188.type_.id_ = INVALID;
  local_188.type_.physical_type_ = ~INVALID;
  local_188.type_._2_6_ = 0;
  local_188.type_.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0
  ;
  local_188.type_.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_a8.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_start = local_238;
  local_a8.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_finish = pVStack_230;
  local_a8.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = local_228;
  local_238 = (pointer)0x0;
  pVStack_230 = (pointer)0x0;
  local_228 = (pointer)0x0;
  Value::MAP((Value *)&local_200,&local_278,&local_258,&local_88,&local_a8);
  DataChunk::SetValue(chunk,4,row_idx,(Value *)&local_200);
  Value::~Value((Value *)&local_200);
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_a8);
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_88);
  LogicalType::~LogicalType(&local_278);
  DataChunk::SetValue(chunk,5,row_idx,&info->partition_keys);
  LogicalType::~LogicalType(&local_258);
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_238);
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_188);
  ::std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  ::~_Rb_tree(&local_d8);
  return;
}

Assistant:

void PhysicalCopyToFile::ReturnStatistics(DataChunk &chunk, idx_t row_idx, CopyToFileInfo &info) {
	auto &file_stats = *info.file_stats;

	// filename VARCHAR
	chunk.SetValue(0, row_idx, info.file_path);
	// count BIGINT
	chunk.SetValue(1, row_idx, Value::UBIGINT(file_stats.row_count));
	// file size bytes BIGINT
	chunk.SetValue(2, row_idx, Value::UBIGINT(file_stats.file_size_bytes));
	// footer size bytes BIGINT
	chunk.SetValue(3, row_idx, file_stats.footer_size_bytes);
	// column statistics map(varchar, map(varchar, varchar))
	map<string, Value> stats;
	for (auto &entry : file_stats.column_statistics) {
		map<string, Value> per_column_stats;
		for (auto &stats_entry : entry.second) {
			per_column_stats.insert(make_pair(stats_entry.first, stats_entry.second));
		}
		vector<Value> stats_keys;
		vector<Value> stats_values;
		for (auto &stats_entry : per_column_stats) {
			stats_keys.emplace_back(stats_entry.first);
			stats_values.emplace_back(std::move(stats_entry.second));
		}
		auto map_value =
		    Value::MAP(LogicalType::VARCHAR, LogicalType::VARCHAR, std::move(stats_keys), std::move(stats_values));
		stats.insert(make_pair(entry.first, std::move(map_value)));
	}
	vector<Value> keys;
	vector<Value> values;
	for (auto &entry : stats) {
		keys.emplace_back(entry.first);
		values.emplace_back(std::move(entry.second));
	}
	auto map_val_type = LogicalType::MAP(LogicalType::VARCHAR, LogicalType::VARCHAR);
	chunk.SetValue(4, row_idx, Value::MAP(LogicalType::VARCHAR, map_val_type, std::move(keys), std::move(values)));

	// partition_keys map(varchar, varchar)
	chunk.SetValue(5, row_idx, info.partition_keys);
}